

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O1

int ngp_hdu_insert_token(NGP_HDU *ngph,NGP_TOKEN *newtok)

{
  char *__s;
  NGP_TOKEN *pNVar1;
  size_t sVar2;
  char *__dest;
  int iVar3;
  
  iVar3 = 0x16a;
  if (newtok != (NGP_TOKEN *)0x0 && ngph != (NGP_HDU *)0x0) {
    if ((long)ngph->tokcnt == 0) {
      pNVar1 = (NGP_TOKEN *)malloc(0xb0);
    }
    else {
      pNVar1 = (NGP_TOKEN *)realloc(ngph->tok,(long)ngph->tokcnt * 0xb0 + 0xb0);
    }
    iVar3 = 0x168;
    if (pNVar1 != (NGP_TOKEN *)0x0) {
      ngph->tok = pNVar1;
      iVar3 = ngph->tokcnt;
      memcpy(pNVar1 + iVar3,newtok,0xb0);
      if ((newtok->type == 2) && (__s = (newtok->value).s, __s != (char *)0x0)) {
        sVar2 = strlen(__s);
        __dest = (char *)malloc(sVar2 + 1);
        pNVar1[iVar3].value.s = __dest;
        if (__dest == (char *)0x0) {
          return 0x168;
        }
        strcpy(__dest,__s);
      }
      ngph->tokcnt = iVar3 + 1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int	ngp_hdu_insert_token(NGP_HDU *ngph, NGP_TOKEN *newtok)
 { NGP_TOKEN *tkp;
   
   if (NULL == ngph) return(NGP_NUL_PTR);
   if (NULL == newtok) return(NGP_NUL_PTR);

   if (0 == ngph->tokcnt)
     tkp = (NGP_TOKEN *)ngp_alloc((ngph->tokcnt + 1) * sizeof(NGP_TOKEN));
   else
     tkp = (NGP_TOKEN *)ngp_realloc(ngph->tok, (ngph->tokcnt + 1) * sizeof(NGP_TOKEN));

   if (NULL == tkp) return(NGP_NO_MEMORY);
       
   ngph->tok = tkp;
   ngph->tok[ngph->tokcnt] = *newtok;

   if (NGP_TTYPE_STRING == newtok->type)
     { if (NULL != newtok->value.s)
         { ngph->tok[ngph->tokcnt].value.s = (char *)ngp_alloc(1 + strlen(newtok->value.s));
           if (NULL == ngph->tok[ngph->tokcnt].value.s) return(NGP_NO_MEMORY);
           strcpy(ngph->tok[ngph->tokcnt].value.s, newtok->value.s);
         }
     }

   ngph->tokcnt++;
   return(NGP_OK);
 }